

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

bool __thiscall
llvm::cl::Option::error(Option *this,Twine *Message,StringRef ArgName,raw_ostream *Errs)

{
  raw_ostream *prVar1;
  size_t __n;
  char *pcVar2;
  size_t sVar3;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  
  __n = ArgName.Length;
  pcVar2 = ArgName.Data;
  sVar3 = __n;
  if (pcVar2 == (char *)0x0) {
    sVar3 = (this->ArgStr).Length;
    pcVar2 = (this->ArgStr).Data;
  }
  if (sVar3 == 0) {
    pcVar2 = (this->HelpStr).Data;
    sVar3 = (this->HelpStr).Length;
    prVar1 = Errs;
  }
  else {
    if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
      ManagedStaticBase::RegisterManagedStatic
                (&GlobalParser.super_ManagedStaticBase,
                 object_creator<(anonymous_namespace)::CommandLineParser>::call,
                 object_deleter<(anonymous_namespace)::CommandLineParser>::call);
    }
    prVar1 = (raw_ostream *)
             raw_ostream::write(Errs,(int)*(undefined8 *)
                                           GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p,
                                *(void **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p
                                          + 8),__n);
    Str.Length = 0xb;
    Str.Data = ": for the -";
    prVar1 = raw_ostream::operator<<(prVar1,Str);
  }
  Str_00.Length = sVar3;
  Str_00.Data = pcVar2;
  raw_ostream::operator<<(prVar1,Str_00);
  Str_01.Length = 9;
  Str_01.Data = " option: ";
  prVar1 = raw_ostream::operator<<(Errs,Str_01);
  Twine::print(Message,prVar1);
  Str_02.Length = 1;
  Str_02.Data = "\n";
  raw_ostream::operator<<(prVar1,Str_02);
  return true;
}

Assistant:

bool Option::error(const Twine &Message, StringRef ArgName, raw_ostream &Errs) {
  if (!ArgName.data())
    ArgName = ArgStr;
  if (ArgName.empty())
    Errs << HelpStr; // Be nice for positional arguments
  else
    Errs << GlobalParser->ProgramName << ": for the -" << ArgName;

  Errs << " option: " << Message << "\n";
  return true;
}